

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O0

PreprocessorOptions * __thiscall
slang::Bag::getOrDefault<slang::parsing::PreprocessorOptions>(Bag *this)

{
  PreprocessorOptions *pPVar1;
  PreprocessorOptions *in_RDI;
  PreprocessorOptions *in_stack_00000008;
  PreprocessorOptions *result;
  PreprocessorOptions *in_stack_00000020;
  Bag *in_stack_00000028;
  
  pPVar1 = get<slang::parsing::PreprocessorOptions>(in_stack_00000028);
  if (pPVar1 == (PreprocessorOptions *)0x0) {
    memset(in_RDI,0,0xa0);
    parsing::PreprocessorOptions::PreprocessorOptions(in_stack_00000020);
  }
  else {
    parsing::PreprocessorOptions::PreprocessorOptions(result,in_stack_00000008);
  }
  return in_RDI;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }